

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::PrepareVAO<unsigned_short>
          (AttributeFormatTest *this,GLint size,GLenum type_gl_name,bool normalized,
          AtributeFormatFunctionType function_selector)

{
  ostringstream *this_00;
  GLuint GVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  char *pcVar6;
  size_t sVar7;
  undefined4 *puVar8;
  undefined7 in_register_00000009;
  char *pcVar9;
  code *pcVar10;
  double dVar11;
  unsigned_short array_data [16];
  Enum<int,_2UL> local_1f8;
  Enum<int,_2UL> local_1e8;
  undefined2 local_1d8;
  undefined2 local_1d6;
  undefined2 local_1d4;
  undefined2 local_1d2;
  undefined2 local_1d0;
  undefined2 local_1ce;
  undefined2 local_1cc;
  undefined2 local_1ca;
  undefined2 local_1c8;
  undefined2 local_1c6;
  undefined2 local_1c4;
  undefined2 local_1c2;
  undefined2 local_1c0;
  undefined2 local_1be;
  undefined2 local_1bc;
  undefined2 local_1ba;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x708))(1,&this->m_vao);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x872);
  (**(code **)(lVar5 + 0xd8))(this->m_vao);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x875);
  if ((int)CONCAT71(in_register_00000009,normalized) == 0) {
    dVar11 = 1.0;
  }
  else {
    dVar11 = 4096.0;
  }
  local_1d8 = 0;
  local_1d6 = (undefined2)(int)dVar11;
  local_1d4 = (undefined2)(int)(dVar11 + dVar11);
  local_1d2 = (undefined2)(int)(dVar11 * 3.0);
  local_1d0 = (undefined2)(int)(dVar11 * 4.0);
  local_1ce = (undefined2)(int)(dVar11 * 5.0);
  local_1cc = (undefined2)(int)(dVar11 * 6.0);
  local_1ca = (undefined2)(int)(dVar11 * 7.0);
  local_1c8 = (undefined2)(int)(dVar11 * 8.0);
  local_1c6 = (undefined2)(int)(dVar11 * 9.0);
  local_1c4 = (undefined2)(int)(dVar11 * 10.0);
  local_1c2 = (undefined2)(int)(dVar11 * 11.0);
  local_1c0 = (undefined2)(int)(dVar11 * 12.0);
  local_1be = (undefined2)(int)(dVar11 * 13.0);
  local_1bc = (undefined2)(int)(dVar11 * 14.0);
  local_1ba = (undefined2)(int)(dVar11 * 15.0);
  (**(code **)(lVar5 + 0x6c8))(1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x881);
  (**(code **)(lVar5 + 0x40))(0x8892,this->m_bo_array);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x884);
  (**(code **)(lVar5 + 0x150))(0x8892,0x20,&local_1d8,0x88e4);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x887);
  pcVar10 = *(code **)(lVar5 + 0x1898);
  uVar4 = (**(code **)(lVar5 + 0x780))(this->m_po,"a_0");
  (*pcVar10)(uVar4,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glVertexAttribBinding call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x88b);
  pcVar10 = *(code **)(lVar5 + 0x1898);
  uVar4 = (**(code **)(lVar5 + 0x780))(this->m_po,"a_1");
  (*pcVar10)(uVar4,1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glVertexAttribBinding call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x88e);
  if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_INTEGER) {
    pcVar10 = *(code **)(lVar5 + 0x16b0);
    GVar1 = this->m_vao;
    uVar4 = (**(code **)(lVar5 + 0x780))(this->m_po,"a_0");
    (*pcVar10)(GVar1,uVar4,size,type_gl_name,0);
    pcVar10 = *(code **)(lVar5 + 0x16b0);
  }
  else {
    if (function_selector != ATTRIBUTE_FORMAT_FUNCTION_DOUBLE) {
      if (function_selector != ATTRIBUTE_FORMAT_FUNCTION_FLOAT) {
        puVar8 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar8 = 0;
        __cxa_throw(puVar8,&int::typeinfo,0);
      }
      pcVar10 = *(code **)(lVar5 + 0x16a8);
      GVar1 = this->m_vao;
      uVar4 = (**(code **)(lVar5 + 0x780))(this->m_po,"a_0");
      (*pcVar10)(GVar1,uVar4,size,type_gl_name,normalized,0);
      pcVar10 = *(code **)(lVar5 + 0x16a8);
      GVar1 = this->m_vao;
      uVar4 = (**(code **)(lVar5 + 0x780))(this->m_po,"a_1");
      (*pcVar10)(GVar1,uVar4,size,type_gl_name,normalized,0);
      goto LAB_00ac2245;
    }
    pcVar10 = *(code **)(lVar5 + 0x16b8);
    GVar1 = this->m_vao;
    uVar4 = (**(code **)(lVar5 + 0x780))(this->m_po,"a_0");
    (*pcVar10)(GVar1,uVar4,size,type_gl_name,0);
    pcVar10 = *(code **)(lVar5 + 0x16b8);
  }
  GVar1 = this->m_vao;
  uVar4 = (**(code **)(lVar5 + 0x780))(this->m_po,"a_1");
  (*pcVar10)(GVar1,uVar4,size,type_gl_name,0);
LAB_00ac2245:
  iVar2 = (**(code **)(lVar5 + 0x800))();
  if (iVar2 == 0) {
    (**(code **)(lVar5 + 0xe0))(0,this->m_bo_array,0,size * 4);
    (**(code **)(lVar5 + 0xe0))(1,this->m_bo_array,(long)size * 2,size * 4);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBufferData call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8be);
    (**(code **)(lVar5 + 0x610))(0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glEnableVertexAttribArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8c1);
    (**(code **)(lVar5 + 0x610))(1);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glEnableVertexAttribArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8c4);
    (**(code **)(lVar5 + 0xd8))(0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBindVertexArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8c7);
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    pcVar9 = "VertexArrayAttrib?Format";
    if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_INTEGER) {
      pcVar9 = "VertexArrayAttribIFormat";
    }
    pcVar6 = "VertexArrayAttribLFormat";
    if (function_selector != ATTRIBUTE_FORMAT_FUNCTION_DOUBLE) {
      pcVar6 = pcVar9;
    }
    pcVar9 = "VertexArrayAttribFormat";
    if (function_selector != ATTRIBUTE_FORMAT_FUNCTION_FLOAT) {
      pcVar9 = pcVar6;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar9,
               (ulong)(function_selector != ATTRIBUTE_FORMAT_FUNCTION_FLOAT) + 0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," has unexpectedly generated ",0x1c);
    local_1e8.m_getName = glu::getErrorName;
    local_1e8.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"error for test with size = ",0x1b);
    std::ostream::operator<<(this_00,size);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", type = ",9);
    local_1f8.m_getName = glu::getTypeName;
    local_1f8.m_value = type_gl_name;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1f8,(ostream *)this_00);
    pcVar9 = ", which was not normalized.";
    if (normalized) {
      pcVar9 = ", which was normalized.";
    }
    pcVar6 = ".";
    if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_FLOAT) {
      pcVar6 = pcVar9;
    }
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar6,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Test fails.\n",0xd);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  return iVar2 == 0;
}

Assistant:

bool AttributeFormatTest::PrepareVAO(glw::GLint size, glw::GLenum type_gl_name, bool normalized,
									 AtributeFormatFunctionType function_selector)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* VAO creation. */
	gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Array buffer 0 creation. */

	const glw::GLdouble scale = normalized ? NormalizationScaleFactor<T>() : 1.0;

	const T array_data[16] = { (T)(0.0 * scale),  (T)(1.0 * scale),  (T)(2.0 * scale),  (T)(3.0 * scale),
							   (T)(4.0 * scale),  (T)(5.0 * scale),  (T)(6.0 * scale),  (T)(7.0 * scale),
							   (T)(8.0 * scale),  (T)(9.0 * scale),  (T)(10.0 * scale), (T)(11.0 * scale),
							   (T)(12.0 * scale), (T)(13.0 * scale), (T)(14.0 * scale), (T)(15.0 * scale) };

	gl.genBuffers(1, &m_bo_array);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_array);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(array_data), array_data, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	/* Attribute setup. */
	gl.vertexAttribBinding(gl.getAttribLocation(m_po, "a_0"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribBinding call failed.");

	gl.vertexAttribBinding(gl.getAttribLocation(m_po, "a_1"), 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribBinding call failed.");

	/* Tested attribute format setup. */
	switch (function_selector)
	{
	case ATTRIBUTE_FORMAT_FUNCTION_FLOAT:
		gl.vertexArrayAttribFormat(m_vao, gl.getAttribLocation(m_po, "a_0"), size, type_gl_name, normalized, 0);
		gl.vertexArrayAttribFormat(m_vao, gl.getAttribLocation(m_po, "a_1"), size, type_gl_name, normalized, 0);
		break;

	case ATTRIBUTE_FORMAT_FUNCTION_DOUBLE:
		gl.vertexArrayAttribLFormat(m_vao, gl.getAttribLocation(m_po, "a_0"), size, type_gl_name, 0);
		gl.vertexArrayAttribLFormat(m_vao, gl.getAttribLocation(m_po, "a_1"), size, type_gl_name, 0);
		break;

	case ATTRIBUTE_FORMAT_FUNCTION_INTEGER:
		gl.vertexArrayAttribIFormat(m_vao, gl.getAttribLocation(m_po, "a_0"), size, type_gl_name, 0);
		gl.vertexArrayAttribIFormat(m_vao, gl.getAttribLocation(m_po, "a_1"), size, type_gl_name, 0);
		break;
	default:
		throw 0;
	}

	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< ((ATTRIBUTE_FORMAT_FUNCTION_FLOAT == function_selector) ?
					"VertexArrayAttribFormat" :
					((ATTRIBUTE_FORMAT_FUNCTION_DOUBLE == function_selector) ?
						 "VertexArrayAttribLFormat" :
						 ((ATTRIBUTE_FORMAT_FUNCTION_INTEGER == function_selector) ? "VertexArrayAttribIFormat" :
																					 "VertexArrayAttrib?Format")))
			<< " has unexpectedly generated " << glu::getErrorStr(error) << "error for test with size = " << size
			<< ", type = " << glu::getTypeStr(type_gl_name)
			<< ((ATTRIBUTE_FORMAT_FUNCTION_FLOAT == function_selector) ?
					(normalized ? ", which was normalized." : ", which was not normalized.") :
					".")
			<< " Test fails.\n"
			<< tcu::TestLog::EndMessage;

		return false;
	}

	gl.bindVertexBuffer(0, m_bo_array, 0, static_cast<glw::GLsizei>(sizeof(T) * size * 2));
	gl.bindVertexBuffer(1, m_bo_array, (glw::GLintptr)((T*)NULL + size),
						static_cast<glw::GLsizei>(sizeof(T) * size * 2));

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	gl.enableVertexAttribArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.enableVertexAttribArray(1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.bindVertexArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	return true;
}